

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPTransporter.h
# Opt level: O3

void __thiscall jaegertracing::utils::HTTPTransporter::~HTTPTransporter(HTTPTransporter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int in_ESI;
  
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__HTTPTransporter_00275110;
  net::Socket::close(&(this->super_Transport)._socket,in_ESI);
  p_Var1 = (this->_protocol).
           super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->_httpClient).
           super___shared_ptr<apache::thrift::transport::THttpClient,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->_buffer).
           super___shared_ptr<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  Transport::~Transport(&this->super_Transport);
  return;
}

Assistant:

~HTTPTransporter() { close(); }